

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physfs_lzmasdk.h
# Opt level: O0

void LzmaDec_InitStateReal(CLzmaDec *p)

{
  uint uVar1;
  uint uVar2;
  UInt16 *pUVar3;
  UInt16 *probs;
  SizeT i;
  SizeT numProbs;
  CLzmaDec *p_local;
  
  uVar1 = (p->prop).lc;
  uVar2 = (p->prop).lp;
  pUVar3 = p->probs;
  for (probs = (UInt16 *)0x0;
      probs < (UInt16 *)(ulong)((0x300 << ((char)uVar1 + (char)uVar2 & 0x1fU)) + 0x736);
      probs = (UInt16 *)((long)probs + 1)) {
    pUVar3[(long)probs] = 0x400;
  }
  p->reps[3] = 1;
  p->reps[2] = 1;
  p->reps[1] = 1;
  p->reps[0] = 1;
  p->state = 0;
  p->needInitState = 0;
  return;
}

Assistant:

static void LzmaDec_InitStateReal(CLzmaDec *p)
{
  SizeT numProbs = LzmaProps_GetNumProbs(&p->prop);
  SizeT i;
  CLzmaProb *probs = p->probs;
  for (i = 0; i < numProbs; i++)
    probs[i] = kBitModelTotal >> 1;
  p->reps[0] = p->reps[1] = p->reps[2] = p->reps[3] = 1;
  p->state = 0;
  p->needInitState = 0;
}